

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O3

int lj_cf_package_module(lua_State *L)

{
  TValue *pTVar1;
  TValue *pTVar2;
  int iVar3;
  char *modname;
  char *pcVar4;
  char *pcVar5;
  int idx;
  bool bVar6;
  lua_Debug ar;
  lua_Debug local_a0;
  
  modname = luaL_checklstring(L,1,(size_t *)0x0);
  pTVar1 = L->base;
  pTVar2 = L->top;
  luaL_pushmodule(L,modname,1);
  lua_getfield(L,-1,"_NAME");
  iVar3 = lua_type(L,-1);
  lua_settop(L,-2);
  if (iVar3 == 0) {
    lua_pushvalue(L,-1);
    lua_setfield(L,-2,"_M");
    lua_pushstring(L,modname);
    lua_setfield(L,-2,"_NAME");
    pcVar4 = strrchr(modname,0x2e);
    pcVar5 = pcVar4 + 1;
    if (pcVar4 == (char *)0x0) {
      pcVar5 = modname;
    }
    lua_pushlstring(L,modname,(long)pcVar5 - (long)modname);
    lua_setfield(L,-2,"_PACKAGE");
  }
  lua_pushvalue(L,-1);
  iVar3 = lua_getstack(L,1,&local_a0);
  if (iVar3 != 0) {
    iVar3 = lua_getinfo(L,"f",&local_a0);
    if (iVar3 != 0) {
      iVar3 = lua_iscfunction(L,-1);
      if (iVar3 == 0) goto LAB_0011e152;
    }
  }
  luaL_error(L,"\'module\' not called from a Lua function");
LAB_0011e152:
  lua_pushvalue(L,-2);
  lua_setfenv(L,-2);
  lua_settop(L,-2);
  iVar3 = (int)((ulong)((long)pTVar2 - (long)pTVar1) >> 3);
  if (1 < iVar3) {
    idx = 2;
    do {
      lua_pushvalue(L,idx);
      lua_pushvalue(L,-2);
      lua_call(L,1,0);
      bVar6 = idx != iVar3;
      idx = idx + 1;
    } while (bVar6);
  }
  return 0;
}

Assistant:

static int lj_cf_package_module(lua_State *L)
{
  const char *modname = luaL_checkstring(L, 1);
  int lastarg = (int)(L->top - L->base);
  luaL_pushmodule(L, modname, 1);
  lua_getfield(L, -1, "_NAME");
  if (!lua_isnil(L, -1)) {  /* Module already initialized? */
    lua_pop(L, 1);
  } else {
    lua_pop(L, 1);
    modinit(L, modname);
  }
  lua_pushvalue(L, -1);
  setfenv(L);
  dooptions(L, lastarg);
  return LJ_52;
}